

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> *field)

{
  unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
  *this_00;
  BindingHash *__args;
  ExternalKind EVar1;
  pointer pIVar2;
  FuncImport *pFVar3;
  TableImport *pTVar4;
  MemoryImport *pMVar5;
  GlobalImport *pGVar6;
  EventImport *pEVar7;
  size_type sVar8;
  ulong uVar9;
  bool bVar10;
  unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> local_c0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
  local_b8;
  Binding local_b0;
  value_type local_88;
  value_type local_80;
  Event *event;
  Event *local_70;
  Global *global;
  Global *local_60;
  Memory *memory;
  Memory *local_50;
  Table *table;
  Table *local_40;
  Func *func;
  unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
  *puStack_30;
  Index index;
  BindingHash *bindings;
  string *name;
  Import *import;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> *field_local;
  Module *this_local;
  
  import = (Import *)field;
  field_local = (unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                 *)this;
  pIVar2 = std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
           operator->(field);
  name = (string *)
         std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get(&pIVar2->import);
  bindings = (BindingHash *)0x0;
  puStack_30 = (unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                *)0x0;
  func._4_4_ = 0xffffffff;
  EVar1 = Import::kind((Import *)name);
  switch(EVar1) {
  case First:
    pFVar3 = cast<wabt::FuncImport,wabt::Import>((Import *)name);
    local_40 = (Table *)&pFVar3->func;
    puStack_30 = (unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                  *)&this->func_bindings;
    bindings = (BindingHash *)local_40;
    sVar8 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size(&this->funcs);
    func._4_4_ = (Index)sVar8;
    table = local_40;
    std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::push_back
              (&this->funcs,(value_type *)&table);
    this->num_func_imports = this->num_func_imports + 1;
    break;
  case Table:
    pTVar4 = cast<wabt::TableImport,wabt::Import>((Import *)name);
    local_50 = (Memory *)&pTVar4->table;
    puStack_30 = (unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                  *)&this->table_bindings;
    bindings = (BindingHash *)local_50;
    sVar8 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size(&this->tables);
    func._4_4_ = (Index)sVar8;
    memory = local_50;
    std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::push_back
              (&this->tables,(value_type *)&memory);
    this->num_table_imports = this->num_table_imports + 1;
    break;
  case Memory:
    pMVar5 = cast<wabt::MemoryImport,wabt::Import>((Import *)name);
    local_60 = (Global *)&pMVar5->memory;
    puStack_30 = (unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                  *)&this->memory_bindings;
    bindings = (BindingHash *)local_60;
    sVar8 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::size(&this->memories);
    func._4_4_ = (Index)sVar8;
    global = local_60;
    std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::push_back
              (&this->memories,(value_type *)&global);
    this->num_memory_imports = this->num_memory_imports + 1;
    break;
  case Global:
    pGVar6 = cast<wabt::GlobalImport,wabt::Import>((Import *)name);
    local_70 = (Event *)&pGVar6->global;
    puStack_30 = (unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                  *)&this->global_bindings;
    bindings = (BindingHash *)local_70;
    sVar8 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::size(&this->globals);
    func._4_4_ = (Index)sVar8;
    event = local_70;
    std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::push_back
              (&this->globals,(value_type *)&event);
    this->num_global_imports = this->num_global_imports + 1;
    break;
  case Event:
    pEVar7 = cast<wabt::EventImport,wabt::Import>((Import *)name);
    local_80 = &pEVar7->event;
    puStack_30 = (unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                  *)&this->event_bindings;
    bindings = (BindingHash *)local_80;
    sVar8 = std::vector<wabt::Event_*,_std::allocator<wabt::Event_*>_>::size(&this->events);
    func._4_4_ = (Index)sVar8;
    local_88 = local_80;
    std::vector<wabt::Event_*,_std::allocator<wabt::Event_*>_>::push_back(&this->events,&local_88);
    this->num_event_imports = this->num_event_imports + 1;
  }
  bVar10 = false;
  if ((bindings != (BindingHash *)0x0) &&
     (bVar10 = false,
     puStack_30 !=
     (unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
      *)0x0)) {
    bVar10 = func._4_4_ != 0xffffffff;
  }
  if (bVar10) {
    uVar9 = std::__cxx11::string::empty();
    __args = bindings;
    this_00 = puStack_30;
    if ((uVar9 & 1) == 0) {
      pIVar2 = std::
               unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
               operator->(field);
      Binding::Binding(&local_b0,
                       &(pIVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField
                        .loc,func._4_4_);
      local_b8._M_cur =
           (__node_type *)
           std::
           unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
           ::emplace<std::__cxx11::string_const&,wabt::Binding>
                     (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __args,&local_b0);
    }
    std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>::push_back
              (&this->imports,(value_type *)&name);
    std::unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>>::
    unique_ptr<wabt::ImportModuleField,std::default_delete<wabt::ImportModuleField>,void>
              ((unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>> *)&local_c0,
               field);
    intrusive_list<wabt::ModuleField>::push_back(&this->fields,&local_c0);
    std::unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>::~unique_ptr
              (&local_c0);
    return;
  }
  __assert_fail("name && bindings && index != kInvalidIndex",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.cc",
                0x1cd,"void wabt::Module::AppendField(std::unique_ptr<ImportModuleField>)");
}

Assistant:

void Module::AppendField(std::unique_ptr<ImportModuleField> field) {
  Import* import = field->import.get();
  const std::string* name = nullptr;
  BindingHash* bindings = nullptr;
  Index index = kInvalidIndex;

  switch (import->kind()) {
    case ExternalKind::Func: {
      Func& func = cast<FuncImport>(import)->func;
      name = &func.name;
      bindings = &func_bindings;
      index = funcs.size();
      funcs.push_back(&func);
      ++num_func_imports;
      break;
    }

    case ExternalKind::Table: {
      Table& table = cast<TableImport>(import)->table;
      name = &table.name;
      bindings = &table_bindings;
      index = tables.size();
      tables.push_back(&table);
      ++num_table_imports;
      break;
    }

    case ExternalKind::Memory: {
      Memory& memory = cast<MemoryImport>(import)->memory;
      name = &memory.name;
      bindings = &memory_bindings;
      index = memories.size();
      memories.push_back(&memory);
      ++num_memory_imports;
      break;
    }

    case ExternalKind::Global: {
      Global& global = cast<GlobalImport>(import)->global;
      name = &global.name;
      bindings = &global_bindings;
      index = globals.size();
      globals.push_back(&global);
      ++num_global_imports;
      break;
    }

    case ExternalKind::Event: {
      Event& event = cast<EventImport>(import)->event;
      name = &event.name;
      bindings = &event_bindings;
      index = events.size();
      events.push_back(&event);
      ++num_event_imports;
      break;
    }
  }

  assert(name && bindings && index != kInvalidIndex);
  if (!name->empty()) {
    bindings->emplace(*name, Binding(field->loc, index));
  }
  imports.push_back(import);
  fields.push_back(std::move(field));
}